

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBICMetropolisSampler.cpp
# Opt level: O1

double calculateLogProposalDistributionValue
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *thetaDestination,
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *phiDestination,
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *alphaSource,
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *betaSource)

{
  ulong uVar1;
  long lVar2;
  pointer pvVar3;
  ulong uVar4;
  double dVar5;
  double local_b0;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  pvVar3 = (thetaDestination->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((thetaDestination->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pvVar3) {
    local_b0 = 0.0;
  }
  else {
    local_b0 = 0.0;
    lVar2 = 0;
    uVar4 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::vector
                (&local_48,
                 (vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar2));
      std::vector<double,_std::allocator<double>_>::vector
                (&local_60,
                 (vector<double,_std::allocator<double>_> *)
                 ((long)&(((alphaSource->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar2));
      dVar5 = calculateDirichletLogPdf(&local_48,&local_60);
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_b0 = local_b0 + dVar5;
      uVar4 = uVar4 + 1;
      pvVar3 = (thetaDestination->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar1 = ((long)(thetaDestination->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
              -0x5555555555555555;
      lVar2 = lVar2 + 0x18;
    } while (uVar4 <= uVar1 && uVar1 - uVar4 != 0);
  }
  pvVar3 = (phiDestination->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((phiDestination->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar3) {
    lVar2 = 0;
    uVar4 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::vector
                (&local_78,
                 (vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar2));
      std::vector<double,_std::allocator<double>_>::vector
                (&local_90,
                 (vector<double,_std::allocator<double>_> *)
                 ((long)&(((betaSource->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar2));
      dVar5 = calculateDirichletLogPdf(&local_78,&local_90);
      if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_b0 = local_b0 + dVar5;
      uVar4 = uVar4 + 1;
      pvVar3 = (phiDestination->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar1 = ((long)(phiDestination->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
              -0x5555555555555555;
      lVar2 = lVar2 + 0x18;
    } while (uVar4 <= uVar1 && uVar1 - uVar4 != 0);
  }
  return local_b0;
}

Assistant:

double calculateLogProposalDistributionValue(const vector<vector<double> > &thetaDestination, const vector<vector<double> > &phiDestination, const vector<vector<double>> alphaSource, const vector<vector<double>> betaSource){
    double logPriorDistributionValue = 0.0;
    for(int d=0; d<thetaDestination.size(); d++){
        logPriorDistributionValue += calculateDirichletLogPdf(thetaDestination[d], alphaSource[d]);
    }
    for(int k=0; k<phiDestination.size(); k++){
        logPriorDistributionValue += calculateDirichletLogPdf(phiDestination[k], betaSource[k]);
    }
    return logPriorDistributionValue;
}